

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O2

void Cgt_ManClean(Cgt_Man_t *p)

{
  if (p->pPart != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pPart);
    p->pPart = (Aig_Man_t *)0x0;
  }
  if (p->pCnf != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnf);
    p->pCnf = (Cnf_Dat_t *)0x0;
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
    p->pSat = (sat_solver *)0x0;
  }
  if (p->vPatts != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vPatts);
    p->vPatts = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Cgt_ManClean( Cgt_Man_t * p )
{
    if ( p->pPart )
    {
        Aig_ManStop( p->pPart );
        p->pPart = NULL;
    }
    if ( p->pCnf )
    {
        Cnf_DataFree( p->pCnf );
        p->pCnf = NULL;
    }
    if ( p->pSat )
    {
        sat_solver_delete( p->pSat );
        p->pSat = NULL;
    }
    if ( p->vPatts )
    {
        Vec_PtrFree( p->vPatts );
        p->vPatts = NULL;
    }
}